

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O1

int main(void)

{
  size_t sVar1;
  double *pdVar2;
  pointer ppVVar3;
  pointer ppVar4;
  int iVar5;
  undefined4 extraout_var;
  Variable<double> *v;
  ostream *poVar6;
  undefined4 extraout_var_00;
  long lVar7;
  type *nn_input_1;
  pointer ppVVar8;
  pointer ppVar9;
  type *nn_input;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  string_view path;
  initializer_list<double> __l_01;
  DataLoader dataloader;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  x_and_ys;
  TensorShape output_shape;
  SGDOptimizer optimizer;
  TensorShape input_shape;
  MyNN mynn;
  allocator_type local_1f1;
  double local_1f0;
  DataLoader local_1e8;
  int local_1cc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1c8;
  unsigned_long local_1b0;
  size_t sStack_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  SGDOptimizer local_188;
  double local_160;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> local_158;
  vector<double,_std::allocator<double>_> local_140;
  size_t local_128;
  size_t sStack_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  double local_100;
  double local_f8;
  undefined8 local_f0;
  function<double_()> local_e8;
  TensorShape local_c8;
  TensorShape local_98;
  NN local_70;
  
  MyNN::MyNN((MyNN *)&local_70);
  yyml::nn::NN::Parameters(&local_158,&local_70);
  yyml::nn::SGDOptimizer::SGDOptimizer(&local_188,&local_158,0.001);
  if (local_158.
      super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b0 = 1;
  sStack_1a8 = 2;
  local_128 = 2;
  iVar5 = 1;
  lVar7 = 0;
  do {
    iVar5 = iVar5 * *(int *)((long)&local_1b0 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  sStack_120 = (size_t)iVar5;
  __l._M_len = 2;
  __l._M_array = &local_1b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_118,__l,(allocator_type *)&local_1e8);
  local_1e8.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  local_1e8.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  local_1b0 = 2;
  iVar5 = 1;
  lVar7 = 0;
  do {
    iVar5 = iVar5 * *(int *)((long)&local_1e8.data_.
                                    super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  sStack_1a8 = (size_t)iVar5;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1a0,__l_00,(allocator_type *)&local_1c8);
  local_98.dim = local_128;
  local_98.total = sStack_120;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_98.dims,&local_118);
  local_c8.dim = local_1b0;
  local_c8.total = sStack_1a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c8.dims,&local_1a0);
  path._M_str = "2d_normal_data.txt";
  path._M_len = 0x12;
  yyml::DataLoader::DataLoader(&local_1e8,path,&local_98,&local_c8);
  if (local_c8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_functor._M_unused._M_object =
       yyml::RandomNumberGenerator::NormalDistribution;
  local_e8._M_invoker = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_e8.super__Function_base._M_manager =
       std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  yyml::nn::OptimizerInterface::Apply(&local_188.super_OptimizerInterface,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  iVar5 = 0;
  do {
    ppVar4 = local_1e8.data_.
             super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1cc = iVar5;
    if (local_1e8.data_.
        super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1e8.data_.
        super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1f0 = 0.0;
    }
    else {
      local_1f0 = 0.0;
      ppVVar8 = local_188.super_OptimizerInterface.parameters_.
                super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVVar3 = local_188.super_OptimizerInterface.parameters_.
                super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar9 = local_1e8.data_.
               super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        for (; ppVVar8 != ppVVar3; ppVVar8 = ppVVar8 + 1) {
          sVar1 = ((*ppVVar8)->grads_).shape_.total;
          if (sVar1 != 0) {
            memset(((*ppVVar8)->grads_).data_,0,sVar1 << 3);
          }
        }
        iVar5 = (**local_70._vptr_NN)(&local_70,ppVar9);
        v = LossFunc((Variable<double> *)CONCAT44(extraout_var,iVar5),&ppVar9->second);
        local_160 = *(v->values_).data_;
        yyml::nn::Backward<double>(v);
        local_1f0 = local_1f0 + local_160;
        yyml::nn::SGDOptimizer::Step(&local_188);
        ppVar9 = ppVar9 + 1;
        ppVVar8 = local_188.super_OptimizerInterface.parameters_.
                  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVVar3 = local_188.super_OptimizerInterface.parameters_.
                  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (ppVar9 != ppVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TensorCreated: ",0xf);
    iVar5 = local_1cc;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TensorCopied: ",0xe);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TensorMoved: ",0xd);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TensorDestroyed: ",0x11);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loss: ",6);
    poVar6 = std::ostream::_M_insert<double>(local_1f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    ppVar4 = local_1e8.data_.
             super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 100);
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1e8.data_.
      super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e8.data_.
      super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar9 = local_1e8.data_.
             super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = (**local_70._vptr_NN)(&local_70,ppVar9);
      pdVar2 = (ppVar9->first).values_.data_;
      local_100 = *pdVar2;
      local_f8 = pdVar2[1];
      local_f0 = **(undefined8 **)(CONCAT44(extraout_var_00,iVar5) + 0x28);
      __l_01._M_len = 3;
      __l_01._M_array = &local_100;
      std::vector<double,_std::allocator<double>_>::vector(&local_140,__l_01,&local_1f1);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&local_1c8,&local_140);
      if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar4);
  }
  OutputResult(&local_1c8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1c8);
  std::
  vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ::~vector(&local_1e8.data_);
  if (local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_188.super_OptimizerInterface._vptr_OptimizerInterface =
       (_func_int **)&PTR___cxa_pure_virtual_0010ed58;
  if (local_188.super_OptimizerInterface.parameters_.
      super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super_OptimizerInterface.parameters_.
                    super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.super_OptimizerInterface.parameters_.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super_OptimizerInterface.parameters_.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_70._vptr_NN = (_func_int **)&PTR___cxa_pure_virtual_0010ec00;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_70.layers_._M_h);
  return 0;
}

Assistant:

int main() {
  MyNN mynn;
  SGDOptimizer optimizer(mynn.Parameters(), 0.001);
  TensorShape input_shape{1, 2}, output_shape{1, 1};
  {
    DataLoader dataloader("2d_normal_data.txt", input_shape, output_shape);
    optimizer.Apply(RandomNumberGenerator::NormalDistribution);

    for (int i = 0; i < 100; i++) {
      double iter_loss = 0;
      for (auto& [nn_input, label] : dataloader) {
        optimizer.ZeroGrad();
        auto* nn_output = mynn(&nn_input);
        auto* loss = LossFunc(nn_output, &label);
        iter_loss += loss->values_.data_[0];
        loss->Backward();
        optimizer.Step();
      }
      std::cout << "TensorCreated: " << Tensor<double>::created_ << std::endl;
      std::cout << "TensorCopied: " << Tensor<double>::copied_ << std::endl;
      std::cout << "TensorMoved: " << Tensor<double>::moved_ << std::endl;
      std::cout << "TensorDestroyed: " << Tensor<double>::destroyed_
                << std::endl;
      std::cout << "Loss: " << iter_loss << std::endl;
    }
    std::vector<std::vector<double>> x_and_ys;
    for (auto& [nn_input, _] : dataloader) {
      auto* nn_output = mynn(&nn_input);
      x_and_ys.emplace_back(std::vector<double>{nn_input.values_.data_[0],
                                                nn_input.values_.data_[1],
                                                nn_output->values_.data_[0]});
    }
    OutputResult(x_and_ys);
  }
}